

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O2

void __thiscall o3dgc::BinaryStream::WriteFloat32Bin(BinaryStream *this,float value)

{
  uchar *value_00;
  undefined4 local_c;
  
  local_c = value;
  if (this->m_endianness == O3DGC_BIG_ENDIAN) {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_c + 3));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_c + 2));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_c + 1));
    value_00 = (uchar *)&local_c;
  }
  else {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)&local_c);
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_c + 1));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_c + 2));
    value_00 = (uchar *)((long)&local_c + 3);
  }
  Vector<unsigned_char>::PushBack(&this->m_stream,value_00);
  return;
}

Assistant:

void                    WriteFloat32Bin(float value) 
                                {
                                    unsigned char * ptr = (unsigned char *) (&value);
                                    if (m_endianness == O3DGC_BIG_ENDIAN)
                                    {
                                        m_stream.PushBack(ptr[3]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[0]);
                                    }
                                    else
                                    {
                                        m_stream.PushBack(ptr[0]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[3]);
                                    }
                                }